

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<ValueSerializer,_IO_FILE>(void *param_1,_IO_FILE *param_2)

{
  bool bVar1;
  int bit_1;
  int bit;
  uchar bits;
  size_type i;
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  uint in_stack_ffffffffffffffdc;
  unsigned_long in_stack_ffffffffffffffe0;
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this;
  bool local_1;
  
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(in_stack_00000070);
  bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                    (param_2,in_stack_ffffffffffffffe0,
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                      (param_2,in_stack_ffffffffffffffe0,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        (param_2,in_stack_ffffffffffffffe0,
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (bVar1) {
        for (this = (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)0x0;
            this < *(dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     **)((long)param_1 + 0x58);
            this = (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&(this->settings).
                       super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                       super_TransparentHasher.super_Hasher.num_compares_) {
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
          for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
            if (((ulong)((long)&(this->settings).
                                super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>
                                .super_TransparentHasher.super_Hasher.id_ + (long)iVar2) <
                 *(ulong *)((long)param_1 + 0x58)) &&
               (bVar1 = dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        ::test_empty(this,CONCAT44(in_stack_ffffffffffffffdc,iVar2)), !bVar1)) {
              in_stack_ffffffffffffffdc =
                   CONCAT13((byte)(in_stack_ffffffffffffffdc >> 0x18) |
                            (byte)(1 << ((byte)iVar2 & 0x1f)),(int3)in_stack_ffffffffffffffdc);
            }
          }
          bVar1 = sparsehash_internal::write_data<_IO_FILE>
                            ((_IO_FILE *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),param_1,
                             0xf33ea4);
          if (!bVar1) {
            return false;
          }
          for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < 8;
              in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
            if (((in_stack_ffffffffffffffdc >> 0x18 & 1 << ((byte)in_stack_ffffffffffffffd4 & 0x1f))
                 != 0) &&
               (bVar1 = ValueSerializer::operator()
                                  ((ValueSerializer *)
                                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                   (FILE *)param_1,(int *)0xf33f05), !bVar1)) {
              return false;
            }
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }